

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O0

void __thiscall
iDynTree::optimalcontrol::HessianBlocksMap::getFullSparsity
          (HessianBlocksMap *this,SparsityStructure *sparsity)

{
  bool bVar1;
  iterator other;
  reference this_00;
  _Rb_tree_iterator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>
  *this_01;
  size_t in_RSI;
  SparsityStructure *in_RDI;
  pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>
  *block;
  iterator __end2;
  iterator __begin2;
  map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>_>
  *__range2;
  map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>_>
  *in_stack_ffffffffffffffb8;
  SparsityStructure *in_stack_ffffffffffffffc0;
  _Self local_28;
  __node_base_ptr *startColumn;
  SparsityStructure *this_02;
  
  this_02 = in_RDI;
  SparsityStructure::clear(in_stack_ffffffffffffffc0);
  startColumn = &(in_RDI->m_register)._M_h._M_single_bucket;
  other = std::
          map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>_>
          ::begin(in_stack_ffffffffffffffb8);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>_>
       ::end(in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffe0,&local_28);
    if (!bVar1) break;
    this_00 = std::
              _Rb_tree_iterator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>
              ::operator*((_Rb_tree_iterator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>
                           *)0x331dcd);
    this_01 = (_Rb_tree_iterator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>
               *)integrators::CollocationHessianIndex::first(&this_00->first);
    integrators::CollocationHessianIndex::second(&this_00->first);
    SparsityStructure::addBlock
              (this_02,in_RSI,(size_t)startColumn,(SparsityStructure *)other._M_node);
    std::
    _Rb_tree_iterator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>
    ::operator++(this_01);
  }
  return;
}

Assistant:

void getFullSparsity(SparsityStructure& sparsity) {
                sparsity.clear();

                for (auto& block : m_sparsity) {
                    sparsity.addBlock(block.first.first(), block.first.second(), block.second);
                }
            }